

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int fileErrors;
  string local_98;
  reference local_78;
  Path *file;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  local_68;
  iterator it;
  TFileList filesToTest;
  unsigned_short proj_1;
  long lStack_40;
  unsigned_short proj;
  size_t numFilesToBuild;
  RuntimeObjectSystem *pRStack_30;
  int numErrors;
  ITestBuildNotifier *failCallbackLocal;
  bool bTestFileTracking_local;
  ITestBuildNotifier *callback_local;
  RuntimeObjectSystem *this_local;
  
  if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)this->m_pCompilerLogger + 0x10))
              (this->m_pCompilerLogger,"TestBuildAllRuntimeSourceFiles Starting\n");
  }
  pRStack_30 = (RuntimeObjectSystem *)callback;
  if (callback == (ITestBuildNotifier *)0x0) {
    pRStack_30 = this;
  }
  numFilesToBuild._4_4_ = 0;
  lStack_40 = 0;
  for (filesToTest.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
      sVar3 = std::
              vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
              ::size(&this->m_Projects),
      filesToTest.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ < sVar3;
      filesToTest.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
           filesToTest.
           super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._6_2_ + 1) {
    pvVar4 = std::
             vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ::operator[](&this->m_Projects,
                          (ulong)filesToTest.
                                 super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
    sVar3 = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::size
                      (&pvVar4->m_RuntimeFileList);
    lStack_40 = sVar3 + lStack_40;
  }
  if (lStack_40 == 0) {
    (*(pRStack_30->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier[2])
              (pRStack_30,0,1);
  }
  filesToTest.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
  do {
    sVar3 = std::
            vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
            ::size(&this->m_Projects);
    if (sVar3 <= filesToTest.
                 super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_) {
      if (numFilesToBuild._4_4_ == 0) {
        if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
          (**(code **)(*(long *)this->m_pCompilerLogger + 0x10))
                    (this->m_pCompilerLogger,"All Tests Passed\n");
        }
      }
      else if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
        (*(code *)**(undefined8 **)this->m_pCompilerLogger)
                  (this->m_pCompilerLogger,"Tests Failed: %d\n",numFilesToBuild._4_4_);
      }
      return numFilesToBuild._4_4_;
    }
    pvVar4 = std::
             vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ::operator[](&this->m_Projects,
                          (ulong)filesToTest.
                                 super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
              ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)&it,
               &pvVar4->m_RuntimeFileList);
    local_68._M_current =
         (Path *)std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::begin
                           ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *
                            )&it);
    while( true ) {
      file = (Path *)std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::end
                               ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                 *)&it);
      bVar1 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
                          *)&file);
      if (!bVar1) break;
      local_78 = __gnu_cxx::
                 __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
                 ::operator*(&local_68);
      FileSystemUtils::Path::Extension_abi_cxx11_(&local_98,local_78);
      bVar1 = std::operator!=(&local_98,".h");
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar1) {
        iVar2 = TestBuildFile(this->m_pCompilerLogger,this,local_78,(ITestBuildNotifier *)pRStack_30
                              ,bTestFileTracking);
        if (iVar2 < 0) {
          if (iVar2 != -0xd1e) {
            numFilesToBuild._4_4_ = numFilesToBuild._4_4_ - iVar2;
          }
          this_local._4_4_ = numFilesToBuild._4_4_;
          bVar1 = true;
          goto LAB_001288cc;
        }
        numFilesToBuild._4_4_ = iVar2 + numFilesToBuild._4_4_;
      }
      __gnu_cxx::
      __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
      ::operator++(&local_68);
    }
    bVar1 = false;
LAB_001288cc:
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
              ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)&it);
    if (bVar1) {
      return this_local._4_4_;
    }
    filesToTest.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ =
         filesToTest.
         super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_2_ + 1;
  } while( true );
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles(  ITestBuildNotifier* callback, bool bTestFileTracking )
{
    if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TestBuildAllRuntimeSourceFiles Starting\n"); }
   
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }
    
    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin(); it != filesToTest.end(); ++it )
        {
            const Path& file = *it;
            if( file.Extension() != ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove, unless -0xD1E is the response (for no error die)
                    if( fileErrors != -0xD1E )
                    {
                        numErrors -= fileErrors;
                    }
                    return numErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}